

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint32_t roaring_bitmap_maximum(roaring_bitmap_t *bm)

{
  uint8_t uVar1;
  uint16_t uVar2;
  int iVar3;
  uint16_t uVar4;
  uint uVar5;
  long lVar6;
  bitset_container_t *container;
  
  iVar3 = (bm->high_low_container).size;
  if (iVar3 < 1) {
    return 0;
  }
  uVar5 = iVar3 - 1;
  container = (bitset_container_t *)(bm->high_low_container).containers[uVar5];
  uVar1 = (bm->high_low_container).typecodes[uVar5];
  if (uVar1 == '\x04') {
    uVar1 = *(uint8_t *)&container->words;
    container = *(bitset_container_t **)container;
  }
  uVar2 = (bm->high_low_container).keys[uVar5];
  if (uVar1 == '\x03') {
    lVar6 = (long)container->cardinality;
    if (lVar6 != 0) {
      uVar4 = *(short *)((long)container->words + lVar6 * 4 + -2) +
              *(short *)((long)container->words + lVar6 * 4 + -4);
      goto LAB_001052d3;
    }
  }
  else {
    if (uVar1 != '\x02') {
      uVar4 = bitset_container_maximum(container);
      goto LAB_001052d3;
    }
    if ((long)container->cardinality != 0) {
      uVar4 = *(uint16_t *)((long)container->words + (long)container->cardinality * 2 + -2);
      goto LAB_001052d3;
    }
  }
  uVar4 = 0;
LAB_001052d3:
  return CONCAT22(uVar2,uVar4);
}

Assistant:

uint32_t roaring_bitmap_maximum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *container =
            bm->high_low_container.containers[bm->high_low_container.size - 1];
        uint8_t typecode =
            bm->high_low_container.typecodes[bm->high_low_container.size - 1];
        uint32_t key =
            bm->high_low_container.keys[bm->high_low_container.size - 1];
        uint32_t lowvalue = container_maximum(container, typecode);
        return lowvalue | (key << 16);
    }
    return 0;
}